

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,WhileStmt *node)

{
  shared_ptr<mocker::ast::ASTNode> local_48 [2];
  shared_ptr<mocker::ast::ASTNode> local_28;
  WhileStmt *local_18;
  WhileStmt *node_local;
  RenameASTIdentifiers *this_local;
  
  local_18 = node;
  node_local = (WhileStmt *)this;
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
            (&local_28,&node->condition);
  visit(this,&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
            (local_48,&local_18->body);
  visit(this,local_48);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_48);
  return;
}

Assistant:

void operator()(ast::WhileStmt &node) const override {
    visit(node.condition);
    visit(node.body);
  }